

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall
QMdiAreaPrivate::_q_processWindowStateChanged
          (QMdiAreaPrivate *this,WindowStates oldState,WindowStates newState)

{
  QMdiSubWindow *activeWindow;
  
  if (this->ignoreWindowStateChange != false) {
    return;
  }
  QObject::sender();
  activeWindow = (QMdiSubWindow *)QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
  if (activeWindow == (QMdiSubWindow *)0x0) {
    return;
  }
  if (((uint)oldState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
             super_QFlagsStorage<Qt::WindowState>.i & 8) == 0) {
    if (((uint)newState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
               super_QFlagsStorage<Qt::WindowState>.i & 8) != 0) {
      emitWindowActivated(this,activeWindow);
      goto LAB_004475a0;
    }
    if (((uint)oldState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
               super_QFlagsStorage<Qt::WindowState>.i & 8) == 0) goto LAB_004475a0;
  }
  else if (((uint)newState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                  super_QFlagsStorage<Qt::WindowState>.i & 8) != 0) goto LAB_004475a0;
  resetActiveWindow(this,activeWindow);
LAB_004475a0:
  if (((uint)newState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
             super_QFlagsStorage<Qt::WindowState>.i & 1) == 0 ||
      ((uint)oldState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
             super_QFlagsStorage<Qt::WindowState>.i & 1) != 0) {
    if (((uint)newState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
               super_QFlagsStorage<Qt::WindowState>.i & 2) != 0 &&
        (char)(((uint)oldState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                      super_QFlagsStorage<Qt::WindowState>.i & 2) >> 1) == '\0') {
      internalRaise(this,activeWindow);
      return;
    }
    if ((((uint)newState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                super_QFlagsStorage<Qt::WindowState>.i & 3) != 0) ||
       (internalRaise(this,activeWindow),
       ((uint)oldState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
              super_QFlagsStorage<Qt::WindowState>.i & 1) == 0)) {
      return;
    }
  }
  else {
    this->isSubWindowsTiled = false;
  }
  arrangeMinimizedSubWindows(this);
  return;
}

Assistant:

void QMdiAreaPrivate::_q_processWindowStateChanged(Qt::WindowStates oldState,
                                                   Qt::WindowStates newState)
{
    if (ignoreWindowStateChange)
        return;

    Q_Q(QMdiArea);
    QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(q->sender());
    if (!child)
        return;

    // windowActivated
    if (!(oldState & Qt::WindowActive) && (newState & Qt::WindowActive))
        emitWindowActivated(child);
    // windowDeactivated
    else if ((oldState & Qt::WindowActive) && !(newState & Qt::WindowActive))
        resetActiveWindow(child);

    // windowMinimized
    if (!(oldState & Qt::WindowMinimized) && (newState & Qt::WindowMinimized)) {
        isSubWindowsTiled = false;
        arrangeMinimizedSubWindows();
    // windowMaximized
    } else if (!(oldState & Qt::WindowMaximized) && (newState & Qt::WindowMaximized)) {
        internalRaise(child);
    // windowRestored
    } else if (!(newState & (Qt::WindowMaximized | Qt::WindowMinimized))) {
        internalRaise(child);
        if (oldState & Qt::WindowMinimized)
            arrangeMinimizedSubWindows();
    }
}